

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

void __thiscall Character::PlayBard(Character *this,uchar instrument,uchar note,bool echo)

{
  Character *pCVar1;
  bool bVar2;
  list<Character_*,_std::allocator<Character_*>_> *plVar3;
  _List_node_base *p_Var4;
  PacketBuilder builder;
  PacketBuilder local_60;
  
  PacketBuilder::PacketBuilder(&local_60,PACKET_JUKEBOX,PACKET_MSG,5);
  PacketBuilder::AddShort(&local_60,(unsigned_short)this->player->id);
  PacketBuilder::AddChar(&local_60,this->direction);
  PacketBuilder::AddChar(&local_60,instrument);
  PacketBuilder::AddChar(&local_60,note);
  p_Var4 = (this->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  plVar3 = &this->map->characters;
  if (p_Var4 != (_List_node_base *)plVar3) {
    do {
      pCVar1 = (Character *)p_Var4[1]._M_next;
      if (echo) {
LAB_00158f03:
        EOClient::Send(pCVar1->player->client,&local_60);
      }
      else if (((pCVar1 != this) && (this->nowhere == false)) && (pCVar1->nowhere == false)) {
        bVar2 = InRange(this,pCVar1->x,pCVar1->y);
        if (bVar2) goto LAB_00158f03;
      }
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)plVar3);
  }
  PacketBuilder::~PacketBuilder(&local_60);
  return;
}

Assistant:

void Character::PlayBard(unsigned char instrument, unsigned char note, bool echo)
{
	PacketBuilder builder(PACKET_JUKEBOX, PACKET_MSG, 5);

	builder.AddShort(this->PlayerID());
	builder.AddChar(this->direction);
	builder.AddChar(instrument);
	builder.AddChar(note);

	UTIL_FOREACH(this->map->characters, character)
	{
		if (!echo && (character == this || !this->InRange(character)))
		{
			continue;
		}

		character->Send(builder);
	}
}